

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O0

void draw_search(Fl_Color col)

{
  Fl_Color col_local;
  
  fl_color(col);
  fl_begin_polygon();
  fl_vertex(-0.4,0.13);
  fl_vertex(-1.0,0.73);
  fl_vertex(-0.73,1.0);
  fl_vertex(-0.13,0.4);
  fl_end_polygon();
  set_outline_color(col);
  fl_line_style(0,3,(char *)0x0);
  fl_begin_loop();
  fl_circle(0.2,-0.2,0.6);
  fl_end_loop();
  fl_line_style(0,1,(char *)0x0);
  fl_begin_loop();
  fl_vertex(-0.4,0.13);
  fl_vertex(-1.0,0.73);
  fl_vertex(-0.73,1.0);
  fl_vertex(-0.13,0.4);
  fl_end_loop();
  return;
}

Assistant:

static void draw_search(Fl_Color col) 
{
  fl_color(col);
  BP; vv(-.4, .13); vv(-1.0, .73); vv(-.73, 1.0); vv(-.13, .4); EP;
  set_outline_color(col);
  fl_line_style(FL_SOLID, 3, 0);
  BC; fl_circle(.2, -.2, .6); EC;
  fl_line_style(FL_SOLID, 1, 0);
  BC; vv(-.4, .13); vv(-1.0, .73); vv(-.73, 1.0); vv(-.13, .4); EC;
}